

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void __thiscall SHA256::transform(SHA256 *this,uchar *message,uint block_nb)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int local_160;
  int local_15c;
  int j;
  int i;
  uchar *sub_block;
  uint32 t2;
  uint32 t1;
  uint32 wv [8];
  uint32 w [64];
  uint block_nb_local;
  uchar *message_local;
  SHA256 *this_local;
  
  for (local_15c = 0; local_15c < (int)block_nb; local_15c = local_15c + 1) {
    iVar1 = local_15c << 6;
    for (local_160 = 0; local_160 < 0x10; local_160 = local_160 + 1) {
      wv[(long)local_160 + 6] =
           CONCAT13(message[(long)(local_160 << 2) + (long)iVar1],
                    CONCAT12(message[(long)(local_160 << 2) + (long)iVar1 + 1],
                             CONCAT11(message[(long)(local_160 << 2) + (long)iVar1 + 2],
                                      message[(long)(local_160 << 2) + (long)iVar1 + 3])));
    }
    for (local_160 = 0x10; local_160 < 0x40; local_160 = local_160 + 1) {
      wv[(long)local_160 + 6] =
           ((wv[(long)(local_160 + -2) + 6] >> 0x11 | wv[(long)(local_160 + -2) + 6] << 0xf) ^
            (wv[(long)(local_160 + -2) + 6] >> 0x13 | wv[(long)(local_160 + -2) + 6] << 0xd) ^
           wv[(long)(local_160 + -2) + 6] >> 10) + wv[(long)(local_160 + -7) + 6] +
           ((wv[(long)(local_160 + -0xf) + 6] >> 7 | wv[(long)(local_160 + -0xf) + 6] << 0x19) ^
            (wv[(long)(local_160 + -0xf) + 6] >> 0x12 | wv[(long)(local_160 + -0xf) + 6] << 0xe) ^
           wv[(long)(local_160 + -0xf) + 6] >> 3) + wv[(long)(local_160 + -0x10) + 6];
    }
    for (local_160 = 0; local_160 < 8; local_160 = local_160 + 1) {
      (&t2)[local_160] = this->m_h[local_160];
    }
    for (local_160 = 0; local_160 < 0x40; local_160 = local_160 + 1) {
      iVar1 = wv[5] + ((wv[2] >> 6 | wv[2] << 0x1a) ^ (wv[2] >> 0xb | wv[2] << 0x15) ^
                      (wv[2] >> 0x19 | wv[2] << 7)) + (wv[2] & wv[3] ^ (wv[2] ^ 0xffffffff) & wv[4])
              + sha256_k[local_160] + wv[(long)local_160 + 6];
      uVar2 = t2 & t1;
      uVar3 = t2 & wv[0];
      uVar4 = t1 & wv[0];
      wv[5] = wv[4];
      wv[4] = wv[3];
      wv[3] = wv[2];
      wv[2] = wv[1] + iVar1;
      wv[1] = wv[0];
      wv[0] = t1;
      t1 = t2;
      t2 = iVar1 + ((t2 >> 2 | t2 << 0x1e) ^ (t2 >> 0xd | t2 << 0x13) ^ (t2 >> 0x16 | t2 << 10)) +
                   (uVar2 ^ uVar3 ^ uVar4);
    }
    for (local_160 = 0; local_160 < 8; local_160 = local_160 + 1) {
      this->m_h[local_160] = (&t2)[local_160] + this->m_h[local_160];
    }
  }
  return;
}

Assistant:

void SHA256::transform(const unsigned char *message, unsigned int block_nb)
{
    uint32 w[64];
    uint32 wv[8];
    uint32 t1, t2;
    const unsigned char *sub_block;
    int i;
    int j;
    for (i = 0; i < (int) block_nb; i++) {
        sub_block = message + (i << 6);
        for (j = 0; j < 16; j++) {
            SHA2_PACK32(&sub_block[j << 2], &w[j]);
        }
        for (j = 16; j < 64; j++) {
            w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
        }
        for (j = 0; j < 8; j++) {
            wv[j] = m_h[j];
        }
        for (j = 0; j < 64; j++) {
            t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                + sha256_k[j] + w[j];
            t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
            wv[7] = wv[6];
            wv[6] = wv[5];
            wv[5] = wv[4];
            wv[4] = wv[3] + t1;
            wv[3] = wv[2];
            wv[2] = wv[1];
            wv[1] = wv[0];
            wv[0] = t1 + t2;
        }
        for (j = 0; j < 8; j++) {
            m_h[j] += wv[j];
        }
    }
}